

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

size_t fibonacci(char *key,int len,uint32_t seed)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  
  uVar3 = (ulong)len;
  uVar1 = (ulong)seed;
  for (pbVar2 = (byte *)key; pbVar2 < key + (uVar3 & 0xfffffffffffffff8); pbVar2 = pbVar2 + 8) {
    uVar1 = uVar1 + *(long *)pbVar2 * -0x61c8864680b583eb;
  }
  if ((uVar3 & 7) != 0) {
    for (; pbVar2 < key + uVar3; pbVar2 = pbVar2 + 1) {
      uVar1 = uVar1 + (ulong)*pbVar2 * -0x61c8864680b583eb;
    }
  }
  return uVar1;
}

Assistant:

size_t
fibonacci(const char *key, int len, uint32_t seed)
{
  size_t h = (size_t)seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
  while (dw < endw) {
    h += *dw++ * UINT64_C(11400714819323198485);
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h += *dc++ * UINT64_C(11400714819323198485);
    }
  }
  return h;
}